

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.hpp
# Opt level: O0

unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_> __thiscall
genericFactory<MetaSim::RandomVar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::create(genericFactory<MetaSim::RandomVar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *className,
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *parms)

{
  bool bVar1;
  reference ppVar2;
  unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_> *in_RSI;
  tuple<MetaSim::RandomVar_*,_std::default_delete<MetaSim::RandomVar>_> in_RDI;
  const_iterator regEntry;
  unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_> ret;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  *in_stack_ffffffffffffff88;
  _Head_base<0UL,_MetaSim::RandomVar_*,_false> this_00;
  _Self local_48 [3];
  _Self local_30 [6];
  
  this_00._M_head_impl =
       (RandomVar *)
       in_RDI.super__Tuple_impl<0UL,_MetaSim::RandomVar_*,_std::default_delete<MetaSim::RandomVar>_>
       .super__Head_base<0UL,_MetaSim::RandomVar_*,_false>._M_head_impl;
  std::unique_ptr<MetaSim::RandomVar,std::default_delete<MetaSim::RandomVar>>::
  unique_ptr<std::default_delete<MetaSim::RandomVar>,void>
            ((unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_> *)
             in_RDI.
             super__Tuple_impl<0UL,_MetaSim::RandomVar_*,_std::default_delete<MetaSim::RandomVar>_>.
             super__Head_base<0UL,_MetaSim::RandomVar_*,_false>._M_head_impl,
             in_stack_ffffffffffffff88);
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x1fb57c);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::operator!=(local_30,local_48);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>_(*)(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>
                          *)0x1fb5bb);
    (*ppVar2->second)((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_00._M_head_impl);
  }
  else {
    std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>::unique_ptr
              ((unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_> *)
               this_00._M_head_impl,
               (unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_> *)
               in_stack_ffffffffffffff88);
  }
  std::unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_>::~unique_ptr(in_RSI)
  ;
  return (__uniq_ptr_data<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>,_true,_true>)
         (__uniq_ptr_data<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>,_true,_true>)
         in_RDI.
         super__Tuple_impl<0UL,_MetaSim::RandomVar_*,_std::default_delete<MetaSim::RandomVar>_>.
         super__Head_base<0UL,_MetaSim::RandomVar_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<manufacturedObj> genericFactory<manufacturedObj, classIDKey>::create(const classIDKey &className, std::vector<std::string> &parms) const
{
  std::unique_ptr<manufacturedObj> ret(nullptr);
  
  typename FN_REGISTRY::const_iterator regEntry=registry.find(className);
  if (regEntry != registry.end()) {
    return (*regEntry).second(parms);
  }
  return ret;
}